

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

bool __thiscall
ON_SimpleArray<ON_SubDComponentId>::QuickSortAndRemoveDuplicates
          (ON_SimpleArray<ON_SubDComponentId> *this,
          _func_int_ON_SubDComponentId_ptr_ON_SubDComponentId_ptr *compar)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ON_SubDComponentId *pOVar6;
  int i;
  long lVar7;
  
  if (this->m_a != (ON_SubDComponentId *)0x0) {
    uVar1 = this->m_count;
    if (compar != (_func_int_ON_SubDComponentId_ptr_ON_SubDComponentId_ptr *)0x0 &&
        0 < (long)(int)uVar1) {
      if (uVar1 < 2) {
        return true;
      }
      lVar5 = 8;
      ON_qsort(this->m_a,(long)(int)uVar1,8,(_func_int_void_ptr_void_ptr *)compar);
      pOVar6 = this->m_a;
      iVar3 = 1;
      lVar7 = 1;
      while( true ) {
        iVar2 = this->m_count;
        lVar4 = (long)iVar3;
        if (iVar2 <= lVar7) break;
        iVar2 = (*compar)(pOVar6,(ON_SubDComponentId *)(this->m_a->m_valueAB + lVar5 + -5));
        if (iVar2 != 0) {
          if (lVar4 < lVar7) {
            this->m_a[lVar4] = this->m_a[lVar7];
          }
          pOVar6 = this->m_a + lVar4;
          iVar3 = iVar3 + 1;
        }
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 8;
      }
      if ((iVar2 - iVar3 != 0 && iVar3 <= iVar2) &&
         (memset(this->m_a + lVar4,0,(long)(iVar2 - iVar3) << 3), -1 < iVar3)) {
        if (this->m_capacity < iVar3) {
          return true;
        }
        this->m_count = iVar3;
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_SimpleArray<T>::QuickSortAndRemoveDuplicates( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar )
  {
    if (m_count > 1)
    {
      ON_qsort(m_a, m_count, sizeof(T), (int(*)(const void*, const void*))compar);
      const T* prev_ele = &m_a[0];
      int clean_count = 1;
      for (int i = 1; i < m_count; ++i)
      {
        if (0 == compar(prev_ele, &m_a[i]))
          continue; // duplicate
        if (i > clean_count)
          m_a[clean_count] = m_a[i];
        prev_ele = &m_a[clean_count];
        ++clean_count;
      }
      if (clean_count < m_count)
      {
        memset( (void*)(&m_a[clean_count]), 0, (m_count-clean_count)*sizeof(T) );
        SetCount(clean_count);
      }
    }
    rc = true;
  }
  return rc;
}